

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment.c
# Opt level: O0

void mi_commit_mask_create(size_t bitidx,size_t bitcount,mi_commit_mask_t *cm)

{
  mi_commit_mask_t *in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  size_t mask;
  size_t count;
  size_t avail;
  size_t ofs;
  size_t i;
  size_t local_50;
  ulong local_48;
  ulong local_28;
  ulong local_20;
  ulong local_10;
  
  if (in_RSI == 0x200) {
    mi_commit_mask_create_full(in_RDX);
  }
  else if (in_RSI == 0) {
    mi_commit_mask_create_empty(in_RDX);
  }
  else {
    mi_commit_mask_create_empty(in_RDX);
    local_20 = in_RDI >> 6;
    local_28 = in_RDI & 0x3f;
    for (local_10 = in_RSI; local_10 != 0; local_10 = local_10 - local_48) {
      local_48 = 0x40 - local_28;
      if (local_10 <= local_48) {
        local_48 = local_10;
      }
      if (local_48 < 0x40) {
        local_50 = (1L << ((byte)local_48 & 0x3f)) + -1 << (sbyte)local_28;
      }
      else {
        local_50 = 0xffffffffffffffff;
      }
      in_RDX->mask[local_20] = local_50;
      local_28 = 0;
      local_20 = local_20 + 1;
    }
  }
  return;
}

Assistant:

static void mi_commit_mask_create(size_t bitidx, size_t bitcount, mi_commit_mask_t* cm) {
  mi_assert_internal(bitidx < MI_COMMIT_MASK_BITS);
  mi_assert_internal((bitidx + bitcount) <= MI_COMMIT_MASK_BITS);
  if (bitcount == MI_COMMIT_MASK_BITS) {
    mi_assert_internal(bitidx==0);
    mi_commit_mask_create_full(cm);
  }
  else if (bitcount == 0) {
    mi_commit_mask_create_empty(cm);
  }
  else {
    mi_commit_mask_create_empty(cm);
    size_t i = bitidx / MI_COMMIT_MASK_FIELD_BITS;
    size_t ofs = bitidx % MI_COMMIT_MASK_FIELD_BITS;
    while (bitcount > 0) {
      mi_assert_internal(i < MI_COMMIT_MASK_FIELD_COUNT);
      size_t avail = MI_COMMIT_MASK_FIELD_BITS - ofs;
      size_t count = (bitcount > avail ? avail : bitcount);
      size_t mask = (count >= MI_COMMIT_MASK_FIELD_BITS ? ~((size_t)0) : (((size_t)1 << count) - 1) << ofs);
      cm->mask[i] = mask;
      bitcount -= count;
      ofs = 0;
      i++;
    }
  }
}